

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

size_t Curl_FormReader(char *buffer,size_t size,size_t nitems,FILE *mydata)

{
  size_t sVar1;
  long lVar2;
  size_t __n;
  size_t size_00;
  char *pcVar3;
  ulong __n_00;
  
  lVar2 = *(long *)mydata;
  if (lVar2 == 0) {
    size_00 = 0;
  }
  else {
    size_00 = nitems * size;
    if ((*(uint *)(lVar2 + 8) & 0xfffffffe) == 2) {
      sVar1 = readfromfile((Form *)mydata,buffer,size_00);
      if (sVar1 != 0) {
        return sVar1;
      }
      lVar2 = *(long *)mydata;
    }
    pcVar3 = mydata->_IO_read_ptr;
    sVar1 = 0;
    while( true ) {
      __n = *(long *)(lVar2 + 0x18) - (long)pcVar3;
      __n_00 = size_00 - sVar1;
      if (__n_00 < __n) break;
      memcpy(buffer + sVar1,pcVar3 + *(long *)(lVar2 + 0x10),__n);
      sVar1 = sVar1 + ((*(long **)mydata)[3] - (long)mydata->_IO_read_ptr);
      mydata->_IO_read_ptr = (char *)0x0;
      lVar2 = **(long **)mydata;
      *(long *)mydata = lVar2;
      if (lVar2 == 0) {
        return sVar1;
      }
      pcVar3 = (char *)0x0;
      if (1 < *(uint *)(lVar2 + 8)) {
        return sVar1;
      }
    }
    memcpy(buffer + sVar1,pcVar3 + *(long *)(lVar2 + 0x10),__n_00);
    mydata->_IO_read_ptr = mydata->_IO_read_ptr + __n_00;
  }
  return size_00;
}

Assistant:

size_t Curl_FormReader(char *buffer,
                       size_t size,
                       size_t nitems,
                       FILE *mydata)
{
  struct Form *form;
  size_t wantedsize;
  size_t gotsize = 0;

  form=(struct Form *)mydata;

  wantedsize = size * nitems;

  if(!form->data)
    return 0; /* nothing, error, empty */

  if((form->data->type == FORM_FILE) ||
     (form->data->type == FORM_CALLBACK)) {
    gotsize = readfromfile(form, buffer, wantedsize);

    if(gotsize)
      /* If positive or -1, return. If zero, continue! */
      return gotsize;
  }
  do {

    if((form->data->length - form->sent ) > wantedsize - gotsize) {

      memcpy(buffer + gotsize , form->data->line + form->sent,
             wantedsize - gotsize);

      form->sent += wantedsize-gotsize;

      return wantedsize;
    }

    memcpy(buffer+gotsize,
           form->data->line + form->sent,
           (form->data->length - form->sent) );
    gotsize += form->data->length - form->sent;

    form->sent = 0;

    form->data = form->data->next; /* advance */

  } while(form->data && (form->data->type < FORM_CALLBACK));
  /* If we got an empty line and we have more data, we proceed to the next
     line immediately to avoid returning zero before we've reached the end. */

  return gotsize;
}